

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O2

void testEraseAttribute(string *name)

{
  uint __line;
  long lVar1;
  long lVar2;
  char *__assertion;
  undefined8 local_50;
  Header header;
  
  local_50 = 0;
  Imf_3_4::Header::Header(&header,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION);
  lVar1 = Imf_3_4::Header::find((string *)&header);
  lVar2 = Imf_3_4::Header::end();
  if (lVar1 == lVar2) {
    __assertion = "header.find (name) != header.end ()";
    __line = 0x41;
  }
  else {
    Imf_3_4::Header::erase((string *)&header);
    lVar1 = Imf_3_4::Header::find((string *)&header);
    lVar2 = Imf_3_4::Header::end();
    if (lVar1 == lVar2) {
      Imf_3_4::Header::~Header(&header);
      return;
    }
    __assertion = "header.find (name) == header.end ()";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,__line,"void testEraseAttribute(const string &)");
}

Assistant:

void
testEraseAttribute (const string& name)
{
    Header header;
    assert (header.find (name) != header.end ());
    header.erase (name);
    assert (header.find (name) == header.end ());
}